

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermOrderingDiagram.cpp
# Opt level: O1

void __thiscall Kernel::TermOrderingDiagram::processVarNode(TermOrderingDiagram *this)

{
  Node *pNVar1;
  Node *pNVar2;
  bool bVar3;
  Trace *this_00;
  Node *pNVar4;
  Node *pNVar5;
  Result val;
  Result local_2c;
  anon_union_8_3_6474b09b_for_Node_2 local_28;
  anon_union_8_2_6f09a3d1_for_Node_4 aStack_20;
  
  pNVar5 = this->_curr->_node;
  this_00 = getCurrentTrace(this);
  bVar3 = TermPartialOrdering::get
                    (this_00,(TermList)(pNVar5->field_1).lhs._content,
                     (TermList)(pNVar5->field_2).rhs._content,&local_2c);
  if (bVar3) {
    if (local_2c == EQUAL) {
      pNVar5 = (pNVar5->eqBranch)._node;
    }
    else if (local_2c == GREATER) {
      pNVar5 = (pNVar5->gtBranch)._node;
    }
    else {
      pNVar5 = (pNVar5->ngeBranch)._node;
    }
    if (pNVar5 != (Node *)0x0) {
      pNVar5->refcnt = pNVar5->refcnt + 1;
    }
    pNVar2 = this->_curr->_node;
    this->_curr->_node = pNVar5;
    if (pNVar2 != (Node *)0x0) {
      Node::decRefCnt(pNVar2);
    }
  }
  else {
    if (1 < pNVar5->refcnt) {
      local_28 = pNVar5->field_1;
      aStack_20 = pNVar5->field_2;
      pNVar4 = (Node *)::operator_new(0x40);
      pNVar4->tag = T_TERM;
      pNVar4->field_1 = local_28;
      pNVar4->field_2 = aStack_20;
      pNVar4->trace = (Trace *)0x0;
      (pNVar4->gtBranch)._node = (Node *)0x0;
      (pNVar4->eqBranch)._node = (Node *)0x0;
      *(undefined8 *)((long)&(pNVar4->eqBranch)._node + 1) = 0;
      *(undefined8 *)((long)&(pNVar4->ngeBranch)._node + 1) = 0;
      pNVar4->refcnt = 1;
      pNVar2 = this->_curr->_node;
      this->_curr->_node = pNVar4;
      if (pNVar2 != (Node *)0x0) {
        Node::decRefCnt(pNVar2);
      }
      pNVar2 = (pNVar5->eqBranch)._node;
      if (pNVar2 != (Node *)0x0) {
        pNVar2->refcnt = pNVar2->refcnt + 1;
      }
      pNVar4 = this->_curr->_node;
      pNVar1 = (pNVar4->eqBranch)._node;
      (pNVar4->eqBranch)._node = pNVar2;
      if (pNVar1 != (Node *)0x0) {
        Node::decRefCnt(pNVar1);
      }
      pNVar2 = (pNVar5->gtBranch)._node;
      if (pNVar2 != (Node *)0x0) {
        pNVar2->refcnt = pNVar2->refcnt + 1;
      }
      pNVar4 = this->_curr->_node;
      pNVar1 = (pNVar4->gtBranch)._node;
      (pNVar4->gtBranch)._node = pNVar2;
      if (pNVar1 != (Node *)0x0) {
        Node::decRefCnt(pNVar1);
      }
      pNVar5 = (pNVar5->ngeBranch)._node;
      if (pNVar5 != (Node *)0x0) {
        pNVar5->refcnt = pNVar5->refcnt + 1;
      }
      pNVar2 = this->_curr->_node;
      pNVar4 = (pNVar2->ngeBranch)._node;
      (pNVar2->ngeBranch)._node = pNVar5;
      if (pNVar4 != (Node *)0x0) {
        Node::decRefCnt(pNVar4);
      }
    }
    pNVar5 = this->_curr->_node;
    pNVar5->ready = true;
    pNVar5->trace = this_00;
  }
  return;
}

Assistant:

void TermOrderingDiagram::processVarNode()
{
  auto node = _curr->node();
  auto trace = getCurrentTrace();
  Ordering::Result val;
  if (trace->get(node->lhs, node->rhs, val)) {
    if (val == Ordering::GREATER) {
      *_curr = node->gtBranch;
    } else if (val == Ordering::EQUAL) {
      *_curr = node->eqBranch;
    } else {
      *_curr = node->ngeBranch;
    }
    return;
  }
  // if refcnt > 1 we have to copy the node,
  // otherwise we can mutate the original
  if (node->refcnt > 1) {
    *_curr = Branch(node->lhs, node->rhs);
    _curr->node()->eqBranch = node->eqBranch;
    _curr->node()->gtBranch = node->gtBranch;
    _curr->node()->ngeBranch = node->ngeBranch;
  }
  _curr->node()->ready = true;
  _curr->node()->trace = trace;
}